

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O3

void Env_arecv_P(Env *env,P *data,size_t n,int proc,int tag,Request_t *request)

{
  if (data == (P *)0x0) {
    __assert_fail("data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1c9,"void Env_arecv_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (n == 0xffffffffffffffff) {
    __assert_fail("n+1 >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1ca,"void Env_arecv_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (proc != 0) {
    __assert_fail("proc>=0 && proc<Env_nproc( env )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1cb,"void Env_arecv_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (-1 < tag) {
    if (request != (Request_t *)0x0) {
      return;
    }
    __assert_fail("request != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1cd,"void Env_arecv_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  __assert_fail("tag>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                ,0x1cc,"void Env_arecv_P(Env *, const P *, size_t, int, int, Request_t *)");
}

Assistant:

void Env_arecv_P( Env* env, const P* data, size_t n, int proc, int tag,
                                                          Request_t* request )
{
  Assert( Env_mpi_are_values_set_( env ) );
  Static_Assert( P_IS_DOUBLE );
  Assert( data != NULL );
  Assert( n+1 >= 1 );
  Assert( proc>=0 && proc<Env_nproc( env ) );
  Assert( tag>=0 );
  Assert( request != NULL );

#ifdef USE_MPI
  const int mpi_code = MPI_Irecv( (void*)data, n, MPI_DOUBLE, proc, tag,
                                       Env_mpi_active_comm_( env ), request );
  Assert( mpi_code == MPI_SUCCESS );
#endif
}